

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O3

void __thiscall StatisticsTracker::update(StatisticsTracker *this,double value)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  byte bVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  lVar3 = this->_count;
  lVar1 = lVar3 + 1;
  this->_count = lVar1;
  bVar2 = (this->_options).doMin;
  if (lVar3 == 0) {
    if (bVar2 != false) {
      this->_minimum = value;
    }
    if ((this->_options).doMax == true) {
      this->_maximum = value;
    }
    if ((this->_options).doMean == true) {
      this->_mean = value;
    }
    if ((this->_options).doVar == true) {
      this->_variance = 0.0;
    }
    if ((this->_options).histogramOptions.enabled == false) {
      return;
    }
    goto LAB_001879f3;
  }
  if ((bVar2 != false) && (value < this->_minimum)) {
    this->_minimum = value;
  }
  if (((this->_options).doMax == true) && (this->_maximum <= value && value != this->_maximum)) {
    this->_maximum = value;
  }
  if ((this->_options).doMean == false) {
    if ((this->_options).doVar == true) {
      dVar5 = value - this->_mean;
      bVar4 = 1;
      goto LAB_001879a9;
    }
  }
  else {
    dVar5 = value - this->_mean;
    this->_mean = dVar5 / (double)lVar1 + this->_mean;
    bVar4 = (this->_options).doVar;
LAB_001879a9:
    if ((bVar4 & 1) != 0) {
      dVar6 = (double)lVar1;
      dVar7 = (dVar6 + -1.0) / dVar6;
      this->_variance = (dVar5 * dVar5 * dVar7) / dVar6 + this->_variance * dVar7;
    }
  }
  if ((this->_options).histogramOptions.enabled != true) {
    return;
  }
LAB_001879f3:
  DynamicHistogram<double>::add(&this->_histogram,value);
  return;
}

Assistant:

void
    update(double const value)
    {

        // update counter
        this->_count++;

        // initialize if first value
        if (this->_count == 1)
        {
            if (this->_options.doMin)
            {
                this->_minimum = value;
            }
            if (this->_options.doMax)
            {
                this->_maximum = value;
            }
            if (this->_options.doMean)
            {
                this->_mean = value;
            }
            if (this->_options.doVar)
            {
                this->_variance = 0;
            }
            if (this->_options.histogramOptions.enabled)
            {
                this->_histogram.add(value);
            }
            return;
        }

        // update min
        if (this->_options.doMin)
        {
            if (value < this->_minimum)
            {
                this->_minimum = value;
            }
        }

        // update max
        if (this->_options.doMax)
        {
            if (value > this->_maximum)
            {
                this->_maximum = value;
            }
        }

        if (this->_options.doMean || this->_options.doVar)
        {
            double delta = value - this->_mean;

            if (this->_options.doMean)
            {
                // update mean
                this->_mean += delta / (double) this->_count;
            }

            if (this->_options.doVar)
            {
                // update variance
                double scale = (this->_count - 1.0) / (double) this->_count;
                this->_variance *= scale;
                this->_variance += delta * delta * scale / (double) this->_count;
                
            }

        }

        if (this->_options.histogramOptions.enabled)
        {
            this->_histogram.add(value);
        }

    }